

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void __thiscall QGuiApplicationPrivate::notifyLayoutDirectionChange(QGuiApplicationPrivate *this)

{
  long i_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  long in_FS_OFFSET;
  int i;
  QEvent ev;
  QWindowList list;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  undefined1 *local_30;
  undefined1 *local_28;
  QList<QWindow_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  iVar3 = 0;
  while( true ) {
    i_00 = (long)iVar3;
    qVar1 = QList<QWindow_*>::size(&local_20);
    if (qVar1 <= i_00) break;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_30,ApplicationLayoutDirectionChange);
    ppQVar2 = QList<QWindow_*>::at
                        ((QList<QWindow_*> *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),i_00);
    QCoreApplication::sendEvent((QObject *)*ppQVar2,(QEvent *)&local_30);
    QEvent::~QEvent((QEvent *)&local_30);
    iVar3 = iVar3 + 1;
  }
  QList<QWindow_*>::~QList((QList<QWindow_*> *)0x36d364);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::notifyLayoutDirectionChange()
{
    const QWindowList list = QGuiApplication::topLevelWindows();
    for (int i = 0; i < list.size(); ++i) {
        QEvent ev(QEvent::ApplicationLayoutDirectionChange);
        QCoreApplication::sendEvent(list.at(i), &ev);
    }
}